

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::PreventExtensions(SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  iVar1 = (*(pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar2,instance);
  return iVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::PreventExtensions(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }